

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O1

DoubleFormatter __thiscall mp::BasicSolver::FormatObjValue(BasicSolver *this,double value)

{
  int iVar1;
  char *__nptr;
  int iVar2;
  DoubleFormatter DVar3;
  
  if (this->obj_precision_ < 0) {
    __nptr = getenv("objective_precision");
    if (__nptr == (char *)0x0) {
      iVar1 = 0;
    }
    else {
      iVar1 = atoi(__nptr);
    }
    iVar2 = 0xf;
    if (iVar1 != 0) {
      iVar2 = iVar1;
    }
    this->obj_precision_ = iVar2;
  }
  DVar3.precision = this->obj_precision_;
  DVar3.value = value;
  DVar3._12_4_ = 0;
  return DVar3;
}

Assistant:

BasicSolver::DoubleFormatter BasicSolver::FormatObjValue(double value) {
  if (obj_precision_ < 0) {
    const char *s =  std::getenv("objective_precision");
    obj_precision_ = s ? std::atoi(s) : 0;
    if (obj_precision_ == 0)
      obj_precision_ = DEFAULT_PRECISION;
  }
  DoubleFormatter formatter = {value, obj_precision_};
  return formatter;
}